

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_aggregate_data.cpp
# Opt level: O2

void __thiscall
duckdb::DistinctAggregateData::DistinctAggregateData
          (DistinctAggregateData *this,DistinctAggregateCollectionInfo *info,GroupingSet *groups,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *group_expressions)

{
  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
  *this_00;
  size_type sVar1;
  pointer puVar2;
  _Rep_type *p_Var3;
  pointer pGVar4;
  const_reference pvVar5;
  pointer pEVar6;
  BoundAggregateExpression *pBVar7;
  mapped_type *pmVar8;
  reference pvVar9;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_01;
  _Base_ptr p_Var10;
  __uniq_ptr_impl<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>_>
  *this_02;
  reference pvVar11;
  pointer this_03;
  type args_1;
  __uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
  *this_04;
  key_type *__k;
  long lVar12;
  idx_t set_idx;
  ulong uVar13;
  pointer this_05;
  vector<duckdb::LogicalType,_true> chunk_types;
  pointer local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  GroupingSet *local_60;
  DistinctAggregateCollectionInfo *local_58;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_50;
  size_type local_48;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  key_type *local_38;
  
  this_00 = &this->radix_tables;
  (this->grouping_sets).
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouping_sets).
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->radix_tables).
  super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->radix_tables).
  super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grouping_sets).
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grouped_aggregate_data).
  super_vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->radix_tables).
  super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouped_aggregate_data).
  super_vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouped_aggregate_data).
  super_vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->info = info;
  local_60 = groups;
  ::std::
  vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ::resize((vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
            *)this,info->table_count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ::resize(&this_00->
            super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ,info->table_count);
  ::std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::resize(&(this->grouping_sets).
            super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           ,info->table_count);
  local_38 = (info->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_40 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&info->table_map;
  p_Var3 = &local_60->_M_t;
  local_58 = info;
  local_50 = group_expressions;
  for (__k = (info->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start; __k != local_38; __k = __k + 1) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(info->aggregates,*__k);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    pBVar7 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar6->super_BaseExpression);
    pmVar8 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(local_40,__k);
    sVar1 = *pmVar8;
    pvVar9 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
             ::get<true>(this_00,sVar1);
    if ((pvVar9->
        super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
        .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl ==
        (RadixPartitionedHashTable *)0x0) {
      this_01 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 *)vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
                   ::get<true>(&this->grouping_sets,sVar1);
      for (p_Var10 = (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &(p_Var3->_M_impl).super__Rb_tree_header;
          p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10)) {
        ::std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>(this_01,(unsigned_long *)(p_Var10 + 1));
      }
      if (local_50 ==
          (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = (long)(local_50->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_50->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
      }
      local_48 = sVar1;
      for (uVar13 = 0;
          uVar13 < (ulong)((long)(pBVar7->children).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pBVar7->children).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar13 = uVar13 + 1) {
        local_78 = (pointer)(uVar13 + lVar12);
        ::std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_insert_unique<unsigned_long>
                  ((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)this_01,(unsigned_long *)&local_78);
      }
      make_uniq<duckdb::GroupedAggregateData>();
      sVar1 = local_48;
      this_02 = (__uniq_ptr_impl<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>_>
                 *)vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                   ::get<true>(&this->grouped_aggregate_data,local_48);
      pGVar4 = local_78;
      local_78 = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>_>
      ::reset(this_02,pGVar4);
      ::std::
      unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>_>::
      ~unique_ptr((unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>_>
                   *)&local_78);
      pvVar11 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                ::get<true>(&this->grouped_aggregate_data,sVar1);
      this_03 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                ::operator->(pvVar11);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(local_58->aggregates,*__k);
      GroupedAggregateData::InitializeDistinct(this_03,pvVar5,local_50);
      pvVar11 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                ::get<true>(&this->grouped_aggregate_data,sVar1);
      args_1 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
               ::operator*(pvVar11);
      make_uniq<duckdb::RadixPartitionedHashTable,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&,duckdb::GroupedAggregateData&>
                ((duckdb *)&local_78,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 this_01,args_1);
      this_04 = (__uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
                 *)vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                   ::get<true>(this_00,sVar1);
      info = local_58;
      pGVar4 = local_78;
      local_78 = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
      ::reset(this_04,(pointer)pGVar4);
      ::std::
      unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
      ::~unique_ptr((unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
                     *)&local_78);
      local_68 = 0;
      local_78 = (pointer)0x0;
      uStack_70 = 0;
      puVar2 = (pBVar7->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_05 = (pBVar7->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_05 != puVar2;
          this_05 = this_05 + 1) {
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_05);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78,
                   &pEVar6->return_type);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78);
    }
  }
  return;
}

Assistant:

DistinctAggregateData::DistinctAggregateData(const DistinctAggregateCollectionInfo &info, const GroupingSet &groups,
                                             const vector<unique_ptr<Expression>> *group_expressions)
    : info(info) {
	grouped_aggregate_data.resize(info.table_count);
	radix_tables.resize(info.table_count);
	grouping_sets.resize(info.table_count);

	for (auto &i : info.indices) {
		auto &aggregate = info.aggregates[i]->Cast<BoundAggregateExpression>();

		D_ASSERT(info.table_map.count(i));
		idx_t table_idx = info.table_map.at(i);
		if (radix_tables[table_idx] != nullptr) {
			//! This aggregate shares a table with another aggregate, and the table is already initialized
			continue;
		}
		// The grouping set contains the indices of the chunk that correspond to the data vector
		// that will be used to figure out in which bucket the payload should be put
		auto &grouping_set = grouping_sets[table_idx];
		//! Populate the group with the children of the aggregate
		for (auto &group : groups) {
			grouping_set.insert(group);
		}
		idx_t group_by_size = group_expressions ? group_expressions->size() : 0;
		for (idx_t set_idx = 0; set_idx < aggregate.children.size(); set_idx++) {
			grouping_set.insert(set_idx + group_by_size);
		}
		// Create the hashtable for the aggregate
		grouped_aggregate_data[table_idx] = make_uniq<GroupedAggregateData>();
		grouped_aggregate_data[table_idx]->InitializeDistinct(info.aggregates[i], group_expressions);
		radix_tables[table_idx] =
		    make_uniq<RadixPartitionedHashTable>(grouping_set, *grouped_aggregate_data[table_idx]);

		// Fill the chunk_types (only contains the payload of the distinct aggregates)
		vector<LogicalType> chunk_types;
		for (auto &child_p : aggregate.children) {
			chunk_types.push_back(child_p->return_type);
		}
	}
}